

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_sod(opj_j2k_t *j2k)

{
  int iVar1;
  opj_cio_t *cio_00;
  undefined8 uVar2;
  int iVar3;
  int a;
  int iVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  void *pvVar8;
  long in_RDI;
  int curtileno;
  opj_cio_t *cio;
  uchar *data_ptr;
  uchar *data;
  int i;
  int truncate;
  int len;
  undefined4 in_stack_ffffffffffffffc0;
  int local_14;
  
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  iVar1 = *(int *)(in_RDI + 0xc);
  if (*(long *)(in_RDI + 0x68) != 0) {
    iVar3 = cio_tell(cio_00);
    *(int *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x68) +
                       (long)*(int *)(in_RDI + 0xc) * 0x260 + 600) +
             (long)*(int *)(in_RDI + 0x14) * 0x14 + 4) = iVar3 + *(int *)(in_RDI + 0x38) + -1;
    if (*(int *)(in_RDI + 0x14) == 0) {
      iVar3 = cio_tell(cio_00);
      *(int *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x68) + (long)*(int *)(in_RDI + 0xc) * 0x260 +
              0x10) = iVar3 + *(int *)(in_RDI + 0x38) + -1;
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x68) + 8) = 0;
  }
  uVar2 = *(undefined8 *)(in_RDI + 0x28);
  puVar7 = cio_getbp(cio_00);
  a = (int)uVar2 - (int)puVar7;
  iVar3 = cio_numbytesleft(cio_00);
  iVar4 = int_min(a,iVar3 + 1);
  iVar5 = cio_numbytesleft(cio_00);
  pvVar8 = realloc(*(void **)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 8),
                   (long)(*(int *)(*(long *)(in_RDI + 0x48) + (long)iVar1 * 4) + iVar4));
  iVar3 = *(int *)(*(long *)(in_RDI + 0x48) + (long)iVar1 * 4);
  for (local_14 = 0; local_14 < iVar4; local_14 = local_14 + 1) {
    uVar6 = cio_read((opj_cio_t *)CONCAT44(a,in_stack_ffffffffffffffc0),(int)((ulong)uVar2 >> 0x20))
    ;
    *(char *)((long)pvVar8 + (long)local_14 + (long)iVar3) = (char)uVar6;
  }
  *(int *)(*(long *)(in_RDI + 0x48) + (long)iVar1 * 4) =
       iVar4 + *(int *)(*(long *)(in_RDI + 0x48) + (long)iVar1 * 4);
  *(void **)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 8) = pvVar8;
  if (iVar4 == iVar5 + 1) {
    *(undefined4 *)(in_RDI + 8) = 0x40;
  }
  else {
    *(undefined4 *)(in_RDI + 8) = 8;
  }
  *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
  return;
}

Assistant:

static void j2k_read_sod(opj_j2k_t *j2k) {
	int len, truncate = 0, i;
	unsigned char *data = NULL, *data_ptr = NULL;

	opj_cio_t *cio = j2k->cio;
	int curtileno = j2k->curtileno;

	/* Index */
	if (j2k->cstr_info) {
		j2k->cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
			cio_tell(cio) + j2k->pos_correction - 1;
		if (j2k->cur_tp_num == 0)
			j2k->cstr_info->tile[j2k->curtileno].end_header = cio_tell(cio) + j2k->pos_correction - 1;
		j2k->cstr_info->packno = 0;
	}
	
	len = int_min(j2k->eot - cio_getbp(cio), cio_numbytesleft(cio) + 1);

	if (len == cio_numbytesleft(cio) + 1) {
		truncate = 1;		/* Case of a truncate codestream */
	}	

	data = j2k->tile_data[curtileno];
	data = (unsigned char*) opj_realloc(data, (j2k->tile_len[curtileno] + len) * sizeof(unsigned char));

	data_ptr = data + j2k->tile_len[curtileno];
	for (i = 0; i < len; i++) {
		data_ptr[i] = cio_read(cio, 1);
	}

	j2k->tile_len[curtileno] += len;
	j2k->tile_data[curtileno] = data;
	
	if (!truncate) {
		j2k->state = J2K_STATE_TPHSOT;
	} else {
		j2k->state = J2K_STATE_NEOC;	/* RAJOUTE !! */
	}
	j2k->cur_tp_num++;
}